

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellBST.cpp
# Opt level: O2

void __thiscall chrono::fea::ChElementShellBST::ComputeNF(ChElementShellBST *this)

{
  ChVectorDynamic<> *in_RCX;
  double *in_RDX;
  ChVectorDynamic<> *in_RSI;
  ChVectorDynamic<> *in_R8;
  ChVectorDynamic<> *in_R9;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  
  ComputeNF((ChElementShellBST *)&this[-1].n,in_XMM0_Qa,in_XMM1_Qa,in_RSI,in_RDX,in_RCX,in_R8,in_R9)
  ;
  return;
}

Assistant:

void ChElementShellBST::ComputeNF(
    const double U,              // parametric coordinate in surface
    const double V,              // parametric coordinate in surface
    ChVectorDynamic<>& Qi,       // Return result of Q = N'*F  here
    double& detJ,                // Return det[J] here
    const ChVectorDynamic<>& F,  // Input F vector, size is =n. field coords.
    ChVectorDynamic<>* state_x,  // if != 0, update state (pos. part) to this, then evaluate Q
    ChVectorDynamic<>* state_w   // if != 0, update state (speed part) to this, then evaluate Q
    ) {
    ShapeVector N;
    ShapeFunctions(N, U, V);

    // det of jacobian at u,v
    detJ = this->area*2.0;  

	Qi.setZero();

    Qi.segment(0, 3) = N(0) * F.segment(0, 3);

    Qi.segment(3, 3) = N(1) * F.segment(0, 3);

    Qi.segment(6, 3) = N(2) * F.segment(0, 3);
}